

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall cnn::Parameters::g_squared_l2norm(Parameters *this,float *sqnorm)

{
  RealScalar *in_RSI;
  Tensor *in_RDI;
  RealScalar RVar1;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *unaff_retaddr;
  
  Tensor::vec(in_RDI);
  RVar1 = Eigen::
          MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>::
          squaredNorm(unaff_retaddr);
  *in_RSI = RVar1;
  return;
}

Assistant:

void Parameters::g_squared_l2norm(float* sqnorm) const {
#if HAVE_CUDA
  gpu::l2_norm_reducer(g.d.size(), g.v, sqnorm, true, false);
#else
  *sqnorm = g.vec().squaredNorm();
#endif
}